

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByPan
          (Registry *this,string *aPan,Network *aRet)

{
  Status SVar1;
  uint16_t panId;
  Network nwk;
  unsigned_short local_aa;
  undefined1 local_a8 [40];
  Network local_80;
  
  Network::Network(&local_80);
  local_aa = 0;
  utils::ParseInteger<unsigned_short>((Error *)local_a8,&local_aa,aPan);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  SVar1 = kError;
  if (local_a8._0_4_ == kNone) {
    local_80.mPan = local_aa;
    SVar1 = LookupOne(this,&local_80,aRet);
  }
  Network::~Network(&local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByPan(const std::string &aPan, Network &aRet)
{
    Network  nwk{};
    uint16_t panId = 0;

    if (utils::ParseInteger(panId, aPan).GetCode() != ErrorCode::kNone)
    {
        return Registry::Status::kError;
    }
    nwk.mPan = panId;
    return LookupOne(nwk, aRet);
}